

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::is_close(matrix4f *a,matrix4f *b,float eps)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = a->m[0][0];
  fVar3 = b->m[0][0];
  fVar2 = ABS(fVar5 - fVar3);
  if (fVar2 <= eps) {
LAB_0035fdc4:
    fVar5 = a->m[0][1];
    fVar3 = b->m[0][1];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[0][2];
    fVar3 = b->m[0][2];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[0][3];
    fVar3 = b->m[0][3];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[1][0];
    fVar3 = b->m[1][0];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[1][1];
    fVar3 = b->m[1][1];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[1][2];
    fVar3 = b->m[1][2];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[1][3];
    fVar3 = b->m[1][3];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[2][0];
    fVar3 = b->m[2][0];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[2][1];
    fVar3 = b->m[2][1];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[2][2];
    fVar3 = b->m[2][2];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[2][3];
    fVar3 = b->m[2][3];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[3][0];
    fVar3 = b->m[3][0];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[3][1];
    fVar3 = b->m[3][1];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[3][2];
    fVar3 = b->m[3][2];
    fVar2 = ABS(fVar5 - fVar3);
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      if ((float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps < fVar2)
      goto LAB_0036020e;
    }
    fVar5 = a->m[3][3];
    fVar3 = b->m[3][3];
    fVar2 = ABS(fVar5 - fVar3);
    bVar1 = true;
    if (eps < fVar2) {
      fVar5 = ABS(fVar5);
      fVar3 = ABS(fVar3);
      fVar4 = fVar3;
      if (fVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      return fVar2 <= (float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) *
                      eps;
    }
  }
  else {
    fVar5 = ABS(fVar5);
    fVar3 = ABS(fVar3);
    fVar4 = fVar3;
    if (fVar3 <= fVar5) {
      fVar4 = fVar5;
    }
    if (fVar2 <= (float)(~-(uint)NAN(fVar5) & (uint)fVar4 | -(uint)NAN(fVar5) & (uint)fVar3) * eps)
    goto LAB_0035fdc4;
LAB_0036020e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_close(const value::matrix4f &a, const value::matrix4f &b, const float eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[0][2], b.m[0][2], eps) &&
         math::is_close(a.m[0][3], b.m[0][3], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps) &&
         math::is_close(a.m[1][2], b.m[1][2], eps) &&
         math::is_close(a.m[1][3], b.m[1][3], eps) &&
         math::is_close(a.m[2][0], b.m[2][0], eps) &&
         math::is_close(a.m[2][1], b.m[2][1], eps) &&
         math::is_close(a.m[2][2], b.m[2][2], eps) &&
         math::is_close(a.m[2][3], b.m[2][3], eps) &&
         math::is_close(a.m[3][0], b.m[3][0], eps) &&
         math::is_close(a.m[3][1], b.m[3][1], eps) &&
         math::is_close(a.m[3][2], b.m[3][2], eps) &&
         math::is_close(a.m[3][3], b.m[3][3], eps);
}